

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int simpleCreate(int argc,char **argv,sqlite3_tokenizer **ppTokenizer)

{
  long lVar1;
  char cVar2;
  int iVar3;
  sqlite3_tokenizer *__s;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  
  iVar3 = sqlite3_initialize();
  if (iVar3 == 0) {
    __s = (sqlite3_tokenizer *)sqlite3Malloc(0x88);
  }
  else {
    __s = (sqlite3_tokenizer *)0x0;
  }
  if (__s == (sqlite3_tokenizer *)0x0) {
    iVar3 = 7;
  }
  else {
    memset(__s,0,0x88);
    if (argc < 2) {
      lVar5 = 0;
      do {
        lVar1 = lVar5 + 1;
        *(char *)((long)&__s[1].pModule + lVar5 + 1) =
             -(((uint)lVar1 & 0x5f) - 0x5b < 0xffffffe6 && (int)lVar5 - 0x39U < 0xfffffff6);
        lVar5 = lVar1;
      } while (lVar1 != 0x7f);
    }
    else {
      sVar4 = strlen(argv[1]);
      if (0 < (int)(uint)sVar4) {
        uVar6 = 0;
        do {
          cVar2 = argv[1][uVar6];
          if ((long)cVar2 < 0) {
            sqlite3_free(__s);
          }
          else {
            *(undefined1 *)((long)&__s[1].pModule + (long)cVar2) = 1;
          }
          if (cVar2 < '\0') {
            return 1;
          }
          uVar6 = uVar6 + 1;
        } while (((uint)sVar4 & 0x7fffffff) != uVar6);
      }
    }
    *ppTokenizer = __s;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int simpleCreate(
  int argc, const char * const *argv,
  sqlite3_tokenizer **ppTokenizer
){
  simple_tokenizer *t;

  t = (simple_tokenizer *) sqlite3_malloc(sizeof(*t));
  if( t==NULL ) return SQLITE_NOMEM;
  memset(t, 0, sizeof(*t));

  /* TODO(shess) Delimiters need to remain the same from run to run,
  ** else we need to reindex.  One solution would be a meta-table to
  ** track such information in the database, then we'd only want this
  ** information on the initial create.
  */
  if( argc>1 ){
    int i, n = (int)strlen(argv[1]);
    for(i=0; i<n; i++){
      unsigned char ch = argv[1][i];
      /* We explicitly don't support UTF-8 delimiters for now. */
      if( ch>=0x80 ){
        sqlite3_free(t);
        return SQLITE_ERROR;
      }
      t->delim[ch] = 1;
    }
  } else {
    /* Mark non-alphanumeric ASCII characters as delimiters */
    int i;
    for(i=1; i<0x80; i++){
      t->delim[i] = !fts3_isalnum(i) ? -1 : 0;
    }
  }

  *ppTokenizer = &t->base;
  return SQLITE_OK;
}